

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

XML_Convert_Result
utf8_toUtf8(ENCODING *UNUSED_enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  XML_Convert_Result XVar1;
  char *pcVar2;
  char *from;
  bool bVar3;
  char *local_38;
  
  from = *fromP;
  local_38 = fromLim;
  align_limit_to_full_utf8_characters(from,&local_38);
  pcVar2 = *toP;
  bVar3 = from < local_38;
  if (pcVar2 < toLim && bVar3) {
    do {
      *pcVar2 = *from;
      from = from + 1;
      pcVar2 = pcVar2 + 1;
      bVar3 = from < local_38;
      if (!bVar3) break;
    } while (pcVar2 < toLim);
  }
  *fromP = from;
  *toP = pcVar2;
  XVar1 = XML_CONVERT_INPUT_INCOMPLETE;
  if (fromLim <= local_38) {
    XVar1 = (uint)(byte)(pcVar2 == toLim & bVar3) * 2;
  }
  return XVar1;
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf8(const ENCODING *UNUSED_P(enc),
            const char **fromP, const char *fromLim,
            char **toP, const char *toLim)
{
  char *to;
  const char *from;
  const char *fromLimInitial = fromLim;

  /* Avoid copying partial characters. */
  align_limit_to_full_utf8_characters(*fromP, &fromLim);

  for (to = *toP, from = *fromP; (from < fromLim) && (to < toLim); from++, to++)
    *to = *from;
  *fromP = from;
  *toP = to;

  if (fromLim < fromLimInitial)
    return XML_CONVERT_INPUT_INCOMPLETE;
  else if ((to == toLim) && (from < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}